

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int call_setter(JSContext *ctx,JSObject *setter,JSValue this_obj,JSValue val,int flags)

{
  int iVar1;
  JSStackFrame *pJVar2;
  JSStackFrame *sf;
  int iVar3;
  JSRefCountHeader *p_2;
  JSValue v;
  JSValue JVar4;
  JSValueUnion local_38;
  int64_t local_30;
  
  local_30 = val.tag;
  local_38 = val.u;
  if (setter == (JSObject *)0x0) {
    if ((0xfffffff4 < (uint)val.tag) &&
       (iVar3 = *local_38.ptr, *(int *)local_38.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,val);
    }
    if (((uint)flags >> 0xe & 1) == 0) {
      if (-1 < (short)flags) {
        return 0;
      }
      pJVar2 = ctx->rt->current_stack_frame;
      if (pJVar2 == (JSStackFrame *)0x0) {
        return 0;
      }
      if ((pJVar2->js_mode & 1) == 0) {
        return 0;
      }
    }
    JS_ThrowTypeError(ctx,"no setter for property");
    iVar3 = -1;
  }
  else {
    (setter->field_0).header.ref_count = (setter->field_0).header.ref_count + 1;
    JVar4.tag = -1;
    JVar4.u.ptr = setter;
    JVar4 = JS_CallFree(ctx,JVar4,this_obj,1,(JSValue *)&local_38);
    if ((0xfffffff4 < (uint)local_30) &&
       (iVar3 = *local_38.ptr, *(int *)local_38.ptr = iVar3 + -1, iVar3 < 2)) {
      v.tag = local_30;
      v.u.ptr = local_38.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    iVar3 = -1;
    if ((((uint)JVar4.tag != 6) && (iVar3 = 1, 0xfffffff4 < (uint)JVar4.tag)) &&
       (iVar1 = *JVar4.u.ptr, *(int *)JVar4.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar4);
    }
  }
  return iVar3;
}

Assistant:

static int call_setter(JSContext *ctx, JSObject *setter,
                       JSValueConst this_obj, JSValue val, int flags)
{
    JSValue ret, func;
    if (likely(setter)) {
        func = JS_MKPTR(JS_TAG_OBJECT, setter);
        /* Note: the field could be removed in the setter */
        func = JS_DupValue(ctx, func);
        ret = JS_CallFree(ctx, func, this_obj, 1, (JSValueConst *)&val);
        JS_FreeValue(ctx, val);
        if (JS_IsException(ret))
            return -1;
        JS_FreeValue(ctx, ret);
        return TRUE;
    } else {
        JS_FreeValue(ctx, val);
        if ((flags & JS_PROP_THROW) ||
            ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
            JS_ThrowTypeError(ctx, "no setter for property");
            return -1;
        }
        return FALSE;
    }
}